

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_barrier_(lua_State *L,GCObject *o,GCObject *v)

{
  byte bVar1;
  global_State *g;
  
  bVar1 = o->marked;
  if (((bVar1 & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
    g = L->l_G;
    if ((byte)((v->marked | bVar1) & (g->currentwhite ^ 0x18)) == 0) {
      if (g->gcstate < 3) {
        reallymarkobject(g,v);
        if ((o->marked & 6) != 0) {
          if ((v->marked & 6) != 0) {
            __assert_fail("!(((v)->marked & 7) > 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x119,"void luaC_barrier_(lua_State *, GCObject *, GCObject *)");
          }
          v->marked = v->marked & 0xf8 | 2;
        }
      }
      else {
        if (6 < g->gcstate) {
          __assert_fail("(3 <= (g)->gcstate && (g)->gcstate <= 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x11e,"void luaC_barrier_(lua_State *, GCObject *, GCObject *)");
        }
        if (g->gckind == '\0') {
          o->marked = g->currentwhite & 0x18 | bVar1 & 199;
        }
      }
      return;
    }
  }
  __assert_fail("(((o)->marked) & ((1<<(5)))) && (((v)->marked) & (((1<<(3)) | (1<<(4))))) && !(((v)->marked) & (((g)->currentwhite ^ ((1<<(3)) | (1<<(4)))))) && !(((o)->marked) & (((g)->currentwhite ^ ((1<<(3)) | (1<<(4))))))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x115,"void luaC_barrier_(lua_State *, GCObject *, GCObject *)");
}

Assistant:

void luaC_barrier_ (lua_State *L, GCObject *o, GCObject *v) {
  global_State *g = G(L);
  lua_assert(isblack(o) && iswhite(v) && !isdead(g, v) && !isdead(g, o));
  if (keepinvariant(g)) {  /* must keep invariant? */
    reallymarkobject(g, v);  /* restore invariant */
    if (isold(o)) {
      lua_assert(!isold(v));  /* white object could not be old */
      setage(v, G_OLD0);  /* restore generational invariant */
    }
  }
  else {  /* sweep phase */
    lua_assert(issweepphase(g));
    if (g->gckind == KGC_INC)  /* incremental mode? */
      makewhite(g, o);  /* mark 'o' as white to avoid other barriers */
  }
}